

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_tga.cxx
# Opt level: O3

void __thiscall xray_re::xr_image::save_tga(xr_image *this,xr_writer *w)

{
  char footer [26];
  uint local_48 [2];
  undefined2 uStack_40;
  undefined2 uStack_3e;
  char acStack_3c [28];
  
  local_48[0] = local_48[0] & 0xffffff00;
  (*w->_vptr_xr_writer[2])(w,local_48,1);
  local_48[0] = local_48[0] & 0xffffff00;
  (*w->_vptr_xr_writer[2])(w,local_48,1);
  local_48[0] = CONCAT31(local_48[0]._1_3_,2);
  (*w->_vptr_xr_writer[2])(w,local_48,1);
  local_48[0] = local_48[0] & 0xffff0000;
  (*w->_vptr_xr_writer[2])(w,local_48,2);
  local_48[0] = local_48[0] & 0xffff0000;
  (*w->_vptr_xr_writer[2])(w,local_48,2);
  local_48[0] = local_48[0] & 0xffffff00;
  (*w->_vptr_xr_writer[2])(w,local_48,1);
  local_48[0] = local_48[0] & 0xffff0000;
  (*w->_vptr_xr_writer[2])(w,local_48,2);
  local_48[0] = local_48[0] & 0xffff0000;
  (*w->_vptr_xr_writer[2])(w,local_48,2);
  local_48[0]._0_2_ = (short)this->m_width;
  (*w->_vptr_xr_writer[2])(w,local_48,2);
  local_48[0] = CONCAT22(local_48[0]._2_2_,(short)this->m_height);
  (*w->_vptr_xr_writer[2])(w,local_48,2);
  local_48[0]._0_1_ = 0x20;
  (*w->_vptr_xr_writer[2])(w,local_48,1);
  local_48[0] = CONCAT31(local_48[0]._1_3_,0x2f);
  (*w->_vptr_xr_writer[2])(w,local_48,1);
  (*w->_vptr_xr_writer[2])(w,this->m_data,(ulong)(this->m_height * this->m_width) << 2);
  builtin_strncpy(acStack_3c + 4,"ON-XFILE.",10);
  local_48[0] = 0;
  local_48[1] = 0;
  uStack_40 = 0x5254;
  uStack_3e = 0x4555;
  builtin_strncpy(acStack_3c,"VISI",4);
  (*w->_vptr_xr_writer[2])(w,local_48,0x1a);
  return;
}

Assistant:

void xr_image::save_tga(xr_writer& w) const
{
	// tga header
	w.w_u8(0);		// ID Length
	w.w_u8(0);		// Color Map Type (none)
	w.w_u8(2);		// Image Type (RGBA)
	w.w_u16(0);
	w.w_u16(0);
	w.w_u8(0);
	w.w_u16(0);		// x
	w.w_u16(0);		// y
	w.w_size_u16(m_width);
	w.w_size_u16(m_height);
	w.w_u8(32);
	w.w_u8(0x2f);
	
	w.w_raw(m_data, m_width*m_height * sizeof(rgba32));

	char footer[] = "\0\0\0\0\0\0\0\0TRUEVISION-XFILE.";
	w.w_raw(footer, sizeof(footer));
}